

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O1

void __thiscall
r_comp::Decompiler::decompile_object
          (Decompiler *this,uint16_t object_index,ostringstream *stream,uint64_t time_offset)

{
  pointer pfVar1;
  void *pvVar2;
  SysObject *pSVar3;
  _Hash_node_base *p_Var4;
  pointer ppSVar5;
  pointer ppSVar6;
  pointer pcVar7;
  ostream *poVar8;
  SysView *pSVar9;
  byte bVar10;
  ushort uVar11;
  OutStream *pOVar12;
  SysObject **ppSVar13;
  mapped_type *pmVar14;
  offset_in_Decompiler_to_subr *poVar15;
  SysView **ppSVar16;
  pointer ppSVar17;
  code *pcVar18;
  bool bVar19;
  ulong uVar20;
  long *plVar21;
  __node_base_ptr p_Var22;
  __node_base_ptr p_Var23;
  ulong uVar24;
  size_t i;
  string s;
  uint16_t local_52;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pOVar12 = this->out_stream;
  local_52 = object_index;
  if (pOVar12 != (OutStream *)0x0) {
    if (pOVar12->stream == stream) goto LAB_001329d9;
    pfVar1 = (pOVar12->positions).m_vector.
             super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    pvVar2 = (pOVar12->code_indexes_to_stream_indexes).m_vector.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    operator_delete(pOVar12);
  }
  pOVar12 = (OutStream *)operator_new(0x40);
  (pOVar12->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar12->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar12->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar12->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar12->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar12->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar12->stream = stream;
  this->out_stream = pOVar12;
LAB_001329d9:
  this->time_offset = time_offset;
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->variable_names)._M_h);
  this->last_variable_id = 0;
  ppSVar13 = r_code::vector<r_code::SysObject_*>::operator[]
                       (&(this->image->code_segment).objects,(ulong)local_52);
  pSVar3 = *ppSVar13;
  this->current_object = (ImageObject *)pSVar3;
  this->indents = 0;
  if ((this->partial_decompilation == false) && (this->ignore_named_objects == true)) {
    uVar24 = (this->named_objects)._M_h._M_bucket_count;
    uVar20 = (ulong)(*(uint *)(pSVar3 + 0x68) & 0xffff) % uVar24;
    p_Var22 = (this->named_objects)._M_h._M_buckets[uVar20 & 0xffffffff];
    p_Var23 = (__node_base_ptr)0x0;
    if (p_Var22 != (__node_base_ptr)0x0) {
      uVar11 = (ushort)*(uint *)(pSVar3 + 0x68);
      p_Var4 = p_Var22->_M_nxt;
      p_Var23 = p_Var22;
      if (*(ushort *)&p_Var22->_M_nxt[1]._M_nxt != uVar11) {
        while (p_Var22 = p_Var4, p_Var4 = p_Var22->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var23 = (__node_base_ptr)0x0;
          if (((ulong)*(ushort *)&p_Var4[1]._M_nxt % uVar24 != uVar20) ||
             (p_Var23 = p_Var22, *(ushort *)&p_Var4[1]._M_nxt == uVar11)) goto LAB_00132b42;
        }
        p_Var23 = (__node_base_ptr)0x0;
      }
    }
LAB_00132b42:
    if ((p_Var23 != (__node_base_ptr)0x0) && (p_Var23->_M_nxt != (_Hash_node_base *)0x0)) {
      return;
    }
  }
  else {
    ppSVar5 = (this->imported_objects).
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar6 = (this->imported_objects).
              super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppSVar5 != ppSVar6) {
      do {
        ppSVar17 = ppSVar5 + 1;
        bVar19 = false;
        if (pSVar3 == *ppSVar5) {
          bVar19 = true;
          break;
        }
        ppSVar5 = ppSVar17;
      } while (ppSVar17 != ppSVar6);
      if (bVar19) {
        uVar24 = (this->named_objects)._M_h._M_bucket_count;
        uVar20 = (ulong)(*(uint *)(pSVar3 + 0x68) & 0xffff) % uVar24;
        p_Var22 = (this->named_objects)._M_h._M_buckets[uVar20 & 0xffffffff];
        p_Var23 = (__node_base_ptr)0x0;
        if (p_Var22 != (__node_base_ptr)0x0) {
          uVar11 = (ushort)*(uint *)(pSVar3 + 0x68);
          p_Var4 = p_Var22->_M_nxt;
          p_Var23 = p_Var22;
          if (*(ushort *)&p_Var22->_M_nxt[1]._M_nxt != uVar11) {
            while (p_Var22 = p_Var4, p_Var4 = p_Var22->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var23 = (__node_base_ptr)0x0;
              if (((ulong)*(ushort *)&p_Var4[1]._M_nxt % uVar24 != uVar20) ||
                 (p_Var23 = p_Var22, *(ushort *)&p_Var4[1]._M_nxt == uVar11)) goto LAB_00132b56;
            }
            p_Var23 = (__node_base_ptr)0x0;
          }
        }
LAB_00132b56:
        if ((p_Var23 != (__node_base_ptr)0x0) && (p_Var23->_M_nxt != (_Hash_node_base *)0x0)) {
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this->out_stream->stream,"imported\n",9);
      }
    }
  }
  pmVar14 = std::__detail::
            _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->object_names,&local_52);
  pcVar7 = (pmVar14->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar7,pcVar7 + pmVar14->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this->out_stream->stream,local_50,local_48);
  this->horizontal_set = false;
  r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),0);
  uVar11 = r_code::Atom::asOpcode();
  poVar15 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                      (&this->renderers,(ulong)uVar11);
  pcVar18 = (code *)*poVar15;
  plVar21 = (long *)((long)&this->out_stream + poVar15[1]);
  if (((ulong)pcVar18 & 1) != 0) {
    pcVar18 = *(code **)(pcVar18 + *plVar21 + -1);
  }
  (*pcVar18)(plVar21,0);
  uVar24 = *(long *)(pSVar3 + 0x58) - *(long *)(pSVar3 + 0x50);
  poVar8 = (ostream *)this->out_stream->stream;
  if ((uVar24 & 0x7fff8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," |[]",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," []",3);
    if ((uVar24 & 0x7fff8) != 0) {
      i = 0;
      do {
        write_indent(this,3);
        ppSVar16 = r_code::vector<r_code::SysView_*>::operator[]
                             ((vector<r_code::SysView_*> *)(pSVar3 + 0x50),i);
        pSVar9 = *ppSVar16;
        this->current_object = (ImageObject *)pSVar9;
        r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar9 + 8),0);
        bVar10 = r_code::Atom::getAtomCount();
        write_view(this,0,(ushort)bVar10);
        i = i + 1;
      } while ((ushort)i < (ushort)((uint)uVar24 >> 3));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"\n",1);
  this->indents = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"\n",1);
  this->indents = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void Decompiler::decompile_object(uint16_t object_index, std::ostringstream *stream, uint64_t time_offset)
{
    if (!out_stream) {
        out_stream = new OutStream(stream);
    } else if (out_stream->stream != stream) {
        delete out_stream;
        out_stream = new OutStream(stream);
    }

    this->time_offset = time_offset;
    variable_names.clear();
    last_variable_id = 0;
    current_object = image->code_segment.objects[object_index];
    SysObject *sys_object = (SysObject *)current_object;
    uint16_t read_index = 0;
    indents = 0;

    if (!partial_decompilation && ignore_named_objects) { // decompilation of the entire memory.
        if (named_objects.find(sys_object->oid) != named_objects.end()) {
            return;
        }
    } else { // decompiling on-the-fly: ignore named objects only if imported.
        bool imported = false;

        for (SysObject *object : imported_objects) {
            if (sys_object == object) {
                imported = true;
                break;
            }
        }

        if (imported) {
            if (named_objects.find(sys_object->oid) != named_objects.end()) {
                return;
            } else {
                *out_stream << "imported\n";
            }
        } else if (sys_object->oid != UINT32_MAX) {
//            *out_stream << "oid: " << sys_object->oid << "\n";
        }
    }

    std::string s = object_names[object_index];
    s += ":";
    *out_stream << s;
    horizontal_set = false;
    (this->*renderers[current_object->code[read_index].asOpcode()])(read_index);
    uint16_t view_count = sys_object->views.size();

    if (view_count) { // write the set of views
        *out_stream << " []";

        for (uint16_t i = 0; i < view_count; ++i) {
            write_indent(3);
            current_object = sys_object->views[i];
            write_view(0, current_object->code[0].getAtomCount());
        }
    } else {
        *out_stream << " |[]";
    }

    write_indent(0);
    write_indent(0);
}